

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp.c
# Opt level: O3

int strcmp(char *__s1,char *__s2)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  
  bVar1 = *__s1;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    pbVar3 = (byte *)(__s1 + 1);
    do {
      if (bVar1 != *__s2) goto LAB_0010511f;
      __s2 = (char *)((byte *)__s2 + 1);
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    bVar1 = 0;
LAB_0010511f:
    uVar2 = (uint)bVar1;
  }
  return uVar2 - (byte)*__s2;
}

Assistant:

int strcmp( const char * s1, const char * s2 )
{
    while ( ( *s1 ) && ( *s1 == *s2 ) )
    {
        ++s1;
        ++s2;
    }

    return ( *( unsigned char * )s1 - * ( unsigned char * )s2 );
}